

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::SearchPrefix(cmFindPackageCommand *this,string *prefix_in)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  cmFileList *pcVar4;
  ulong uVar5;
  bool bVar6;
  allocator local_861;
  string local_860;
  cmFileListGeneratorCaseInsensitive local_840;
  cmFileListGeneratorProject local_810;
  cmFileListGeneratorEnumerate local_7f0;
  cmFileListGeneratorProject local_7d8;
  cmFileListGeneratorFixed local_7b8;
  undefined1 local_788 [8];
  cmFindPackageFileList lister_8;
  cmFileListGeneratorEnumerate local_740;
  cmFileListGeneratorProject local_728;
  cmFileListGeneratorFixed local_708;
  undefined1 local_6d8 [8];
  cmFindPackageFileList lister_7;
  allocator local_689;
  string local_688;
  cmFileListGeneratorFixed local_668;
  cmFileListGeneratorEnumerate local_638;
  cmFileListGeneratorProject local_620;
  cmFileListGeneratorFixed local_600;
  undefined1 local_5d0 [8];
  cmFindPackageFileList lister_6;
  string local_5a0;
  cmFileListGeneratorCaseInsensitive local_580;
  cmFileListGeneratorProject local_550;
  cmFileListGeneratorEnumerate local_530;
  cmFileListGeneratorFixed local_518;
  undefined1 local_4e8 [8];
  cmFindPackageFileList lister_5;
  cmFileListGeneratorEnumerate local_4a0;
  cmFileListGeneratorFixed local_488;
  undefined1 local_458 [8];
  cmFindPackageFileList lister_4;
  allocator local_409;
  string local_408;
  cmFileListGeneratorFixed local_3e8;
  cmFileListGeneratorEnumerate local_3b8;
  cmFileListGeneratorFixed local_3a0;
  undefined1 local_370 [8];
  cmFindPackageFileList lister_3;
  value_type local_340;
  allocator local_319;
  value_type local_318;
  allocator local_2f1;
  value_type local_2f0;
  allocator local_2c9;
  value_type local_2c8;
  allocator local_2a1;
  value_type local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  common;
  string local_240;
  cmFileListGeneratorCaseInsensitive local_220;
  cmFileListGeneratorProject local_1f0;
  cmFileListGeneratorFixed local_1d0;
  undefined1 local_1a0 [8];
  cmFindPackageFileList lister_2;
  cmFileListGeneratorFixed local_158;
  undefined1 local_128 [8];
  cmFindPackageFileList lister_1;
  string local_f8;
  cmFileListGeneratorCaseInsensitive local_d8;
  cmFileListGeneratorFixed local_a8;
  undefined1 local_68 [8];
  cmFindPackageFileList lister;
  string prefix;
  string *prefix_in_local;
  cmFindPackageCommand *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar6 = false;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)prefix_in);
    bVar6 = *pcVar2 == '/';
  }
  __stream = _stderr;
  if (bVar6) {
    if ((this->DebugMode & 1U) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"Checking prefix [%s]\n",uVar3);
    }
    bVar6 = cmsys::SystemTools::FileIsDirectory(prefix_in);
    if (bVar6) {
      bVar6 = SearchDirectory(this,prefix_in);
      if (bVar6) {
        this_local._7_1_ = 1;
      }
      else {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&lister.UseSuffixes,(ulong)prefix_in);
        cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_68,this,true);
        cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_a8,(string *)&lister.UseSuffixes);
        pcVar4 = cmFileList::operator/
                           ((cmFileList *)local_68,&local_a8.super_cmFileListGeneratorBase);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,"cmake",(allocator *)&lister_1.field_0x27);
        cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive(&local_d8,&local_f8);
        cmFileList::operator/(pcVar4,&local_d8.super_cmFileListGeneratorBase);
        cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&lister_1.field_0x27);
        cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_a8);
        lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_68);
        if (lister_1.UseSuffixes) {
          this_local._7_1_ = 1;
        }
        lister_1._33_3_ = 0;
        cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_68);
        if (lister_1._32_4_ == 0) {
          cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_128,this,true)
          ;
          cmFileListGeneratorFixed::cmFileListGeneratorFixed
                    (&local_158,(string *)&lister.UseSuffixes);
          pcVar4 = cmFileList::operator/
                             ((cmFileList *)local_128,&local_158.super_cmFileListGeneratorBase);
          cmFileListGeneratorProject::cmFileListGeneratorProject
                    ((cmFileListGeneratorProject *)&lister_2.UseSuffixes,&this->Names,
                     this->SortOrder,this->SortDirection);
          cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_2.UseSuffixes);
          cmFileListGeneratorProject::~cmFileListGeneratorProject
                    ((cmFileListGeneratorProject *)&lister_2.UseSuffixes);
          cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_158);
          lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_128);
          if (lister_1.UseSuffixes) {
            this_local._7_1_ = 1;
          }
          lister_1._33_3_ = 0;
          cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_128);
          if (lister_1._32_4_ == 0) {
            cmFindPackageFileList::cmFindPackageFileList
                      ((cmFindPackageFileList *)local_1a0,this,true);
            cmFileListGeneratorFixed::cmFileListGeneratorFixed
                      (&local_1d0,(string *)&lister.UseSuffixes);
            pcVar4 = cmFileList::operator/
                               ((cmFileList *)local_1a0,&local_1d0.super_cmFileListGeneratorBase);
            cmFileListGeneratorProject::cmFileListGeneratorProject
                      (&local_1f0,&this->Names,this->SortOrder,this->SortDirection);
            pcVar4 = cmFileList::operator/(pcVar4,&local_1f0.super_cmFileListGeneratorBase);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_240,"cmake",
                       (allocator *)
                       ((long)&common.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
                      (&local_220,&local_240);
            cmFileList::operator/(pcVar4,&local_220.super_cmFileListGeneratorBase);
            cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_220);
            std::__cxx11::string::~string((string *)&local_240);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&common.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_1f0);
            cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_1d0);
            lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_1a0);
            if (lister_1.UseSuffixes) {
              this_local._7_1_ = 1;
            }
            lister_1._33_3_ = 0;
            cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_1a0);
            if (lister_1._32_4_ == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_260);
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) == 0) {
                std::operator+(&local_280,"lib/",&this->LibraryArchitecture);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_260,&local_280);
                std::__cxx11::string::~string((string *)&local_280);
              }
              if ((this->UseLib32Paths & 1U) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_2a0,"lib32",&local_2a1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_260,&local_2a0);
                std::__cxx11::string::~string((string *)&local_2a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
              }
              if ((this->UseLib64Paths & 1U) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_2c8,"lib64",&local_2c9);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_260,&local_2c8);
                std::__cxx11::string::~string((string *)&local_2c8);
                std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
              }
              if ((this->UseLibx32Paths & 1U) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_2f0,"libx32",&local_2f1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_260,&local_2f0);
                std::__cxx11::string::~string((string *)&local_2f0);
                std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_318,"lib",&local_319);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260,&local_318);
              std::__cxx11::string::~string((string *)&local_318);
              std::allocator<char>::~allocator((allocator<char> *)&local_319);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_340,"share",(allocator *)&lister_3.field_0x27);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260,&local_340);
              std::__cxx11::string::~string((string *)&local_340);
              std::allocator<char>::~allocator((allocator<char> *)&lister_3.field_0x27);
              cmFindPackageFileList::cmFindPackageFileList
                        ((cmFindPackageFileList *)local_370,this,true);
              cmFileListGeneratorFixed::cmFileListGeneratorFixed
                        (&local_3a0,(string *)&lister.UseSuffixes);
              pcVar4 = cmFileList::operator/
                                 ((cmFileList *)local_370,&local_3a0.super_cmFileListGeneratorBase);
              cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                        (&local_3b8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_260);
              pcVar4 = cmFileList::operator/(pcVar4,&local_3b8.super_cmFileListGeneratorBase);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_408,"cmake",&local_409);
              cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_3e8,&local_408);
              pcVar4 = cmFileList::operator/(pcVar4,&local_3e8.super_cmFileListGeneratorBase);
              cmFileListGeneratorProject::cmFileListGeneratorProject
                        ((cmFileListGeneratorProject *)&lister_4.UseSuffixes,&this->Names,
                         this->SortOrder,this->SortDirection);
              cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_4.UseSuffixes);
              cmFileListGeneratorProject::~cmFileListGeneratorProject
                        ((cmFileListGeneratorProject *)&lister_4.UseSuffixes);
              cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_3e8);
              std::__cxx11::string::~string((string *)&local_408);
              std::allocator<char>::~allocator((allocator<char> *)&local_409);
              cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_3b8);
              cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_3a0);
              lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_370);
              if (lister_1.UseSuffixes) {
                this_local._7_1_ = 1;
              }
              lister_1._33_3_ = 0;
              cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_370);
              if (lister_1._32_4_ == 0) {
                cmFindPackageFileList::cmFindPackageFileList
                          ((cmFindPackageFileList *)local_458,this,true);
                cmFileListGeneratorFixed::cmFileListGeneratorFixed
                          (&local_488,(string *)&lister.UseSuffixes);
                pcVar4 = cmFileList::operator/
                                   ((cmFileList *)local_458,&local_488.super_cmFileListGeneratorBase
                                   );
                cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                          (&local_4a0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_260);
                pcVar4 = cmFileList::operator/(pcVar4,&local_4a0.super_cmFileListGeneratorBase);
                cmFileListGeneratorProject::cmFileListGeneratorProject
                          ((cmFileListGeneratorProject *)&lister_5.UseSuffixes,&this->Names,
                           this->SortOrder,this->SortDirection);
                cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_5.UseSuffixes);
                cmFileListGeneratorProject::~cmFileListGeneratorProject
                          ((cmFileListGeneratorProject *)&lister_5.UseSuffixes);
                cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_4a0);
                cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_488);
                lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_458);
                if (lister_1.UseSuffixes) {
                  this_local._7_1_ = 1;
                }
                lister_1._33_3_ = 0;
                cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_458);
                if (lister_1._32_4_ == 0) {
                  cmFindPackageFileList::cmFindPackageFileList
                            ((cmFindPackageFileList *)local_4e8,this,true);
                  cmFileListGeneratorFixed::cmFileListGeneratorFixed
                            (&local_518,(string *)&lister.UseSuffixes);
                  pcVar4 = cmFileList::operator/
                                     ((cmFileList *)local_4e8,
                                      &local_518.super_cmFileListGeneratorBase);
                  cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                            (&local_530,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_260);
                  pcVar4 = cmFileList::operator/(pcVar4,&local_530.super_cmFileListGeneratorBase);
                  cmFileListGeneratorProject::cmFileListGeneratorProject
                            (&local_550,&this->Names,this->SortOrder,this->SortDirection);
                  pcVar4 = cmFileList::operator/(pcVar4,&local_550.super_cmFileListGeneratorBase);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_5a0,"cmake",(allocator *)&lister_6.field_0x27);
                  cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
                            (&local_580,&local_5a0);
                  cmFileList::operator/(pcVar4,&local_580.super_cmFileListGeneratorBase);
                  cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive
                            (&local_580);
                  std::__cxx11::string::~string((string *)&local_5a0);
                  std::allocator<char>::~allocator((allocator<char> *)&lister_6.field_0x27);
                  cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_550);
                  cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_530);
                  cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_518);
                  lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_4e8);
                  if (lister_1.UseSuffixes) {
                    this_local._7_1_ = 1;
                  }
                  lister_1._33_3_ = 0;
                  cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_4e8);
                  if (lister_1._32_4_ == 0) {
                    cmFindPackageFileList::cmFindPackageFileList
                              ((cmFindPackageFileList *)local_5d0,this,true);
                    cmFileListGeneratorFixed::cmFileListGeneratorFixed
                              (&local_600,(string *)&lister.UseSuffixes);
                    pcVar4 = cmFileList::operator/
                                       ((cmFileList *)local_5d0,
                                        &local_600.super_cmFileListGeneratorBase);
                    cmFileListGeneratorProject::cmFileListGeneratorProject
                              (&local_620,&this->Names,this->SortOrder,this->SortDirection);
                    pcVar4 = cmFileList::operator/(pcVar4,&local_620.super_cmFileListGeneratorBase);
                    cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                              (&local_638,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_260);
                    pcVar4 = cmFileList::operator/(pcVar4,&local_638.super_cmFileListGeneratorBase);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_688,"cmake",&local_689);
                    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_668,&local_688);
                    pcVar4 = cmFileList::operator/(pcVar4,&local_668.super_cmFileListGeneratorBase);
                    cmFileListGeneratorProject::cmFileListGeneratorProject
                              ((cmFileListGeneratorProject *)&lister_7.UseSuffixes,&this->Names,
                               this->SortOrder,this->SortDirection);
                    cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_7.UseSuffixes);
                    cmFileListGeneratorProject::~cmFileListGeneratorProject
                              ((cmFileListGeneratorProject *)&lister_7.UseSuffixes);
                    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_668);
                    std::__cxx11::string::~string((string *)&local_688);
                    std::allocator<char>::~allocator((allocator<char> *)&local_689);
                    cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_638);
                    cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_620);
                    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_600);
                    lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_5d0);
                    if (lister_1.UseSuffixes) {
                      this_local._7_1_ = 1;
                    }
                    lister_1._33_3_ = 0;
                    cmFindPackageFileList::~cmFindPackageFileList
                              ((cmFindPackageFileList *)local_5d0);
                    if (lister_1._32_4_ == 0) {
                      cmFindPackageFileList::cmFindPackageFileList
                                ((cmFindPackageFileList *)local_6d8,this,true);
                      cmFileListGeneratorFixed::cmFileListGeneratorFixed
                                (&local_708,(string *)&lister.UseSuffixes);
                      pcVar4 = cmFileList::operator/
                                         ((cmFileList *)local_6d8,
                                          &local_708.super_cmFileListGeneratorBase);
                      cmFileListGeneratorProject::cmFileListGeneratorProject
                                (&local_728,&this->Names,this->SortOrder,this->SortDirection);
                      pcVar4 = cmFileList::operator/
                                         (pcVar4,&local_728.super_cmFileListGeneratorBase);
                      cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                                (&local_740,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_260);
                      pcVar4 = cmFileList::operator/
                                         (pcVar4,&local_740.super_cmFileListGeneratorBase);
                      cmFileListGeneratorProject::cmFileListGeneratorProject
                                ((cmFileListGeneratorProject *)&lister_8.UseSuffixes,&this->Names,
                                 this->SortOrder,this->SortDirection);
                      cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_8.UseSuffixes)
                      ;
                      cmFileListGeneratorProject::~cmFileListGeneratorProject
                                ((cmFileListGeneratorProject *)&lister_8.UseSuffixes);
                      cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_740);
                      cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_728);
                      cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_708);
                      lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_6d8);
                      if (lister_1.UseSuffixes) {
                        this_local._7_1_ = 1;
                      }
                      lister_1._33_3_ = 0;
                      cmFindPackageFileList::~cmFindPackageFileList
                                ((cmFindPackageFileList *)local_6d8);
                      if (lister_1._32_4_ == 0) {
                        cmFindPackageFileList::cmFindPackageFileList
                                  ((cmFindPackageFileList *)local_788,this,true);
                        cmFileListGeneratorFixed::cmFileListGeneratorFixed
                                  (&local_7b8,(string *)&lister.UseSuffixes);
                        pcVar4 = cmFileList::operator/
                                           ((cmFileList *)local_788,
                                            &local_7b8.super_cmFileListGeneratorBase);
                        cmFileListGeneratorProject::cmFileListGeneratorProject
                                  (&local_7d8,&this->Names,this->SortOrder,this->SortDirection);
                        pcVar4 = cmFileList::operator/
                                           (pcVar4,&local_7d8.super_cmFileListGeneratorBase);
                        cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                                  (&local_7f0,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_260);
                        pcVar4 = cmFileList::operator/
                                           (pcVar4,&local_7f0.super_cmFileListGeneratorBase);
                        cmFileListGeneratorProject::cmFileListGeneratorProject
                                  (&local_810,&this->Names,this->SortOrder,this->SortDirection);
                        pcVar4 = cmFileList::operator/
                                           (pcVar4,&local_810.super_cmFileListGeneratorBase);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_860,"cmake",&local_861);
                        cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
                                  (&local_840,&local_860);
                        cmFileList::operator/(pcVar4,&local_840.super_cmFileListGeneratorBase);
                        cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive
                                  (&local_840);
                        std::__cxx11::string::~string((string *)&local_860);
                        std::allocator<char>::~allocator((allocator<char> *)&local_861);
                        cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_810);
                        cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_7f0);
                        cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_7d8);
                        cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_7b8);
                        lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_788);
                        if (lister_1.UseSuffixes) {
                          this_local._7_1_ = 1;
                        }
                        lister_1._33_3_ = 0;
                        cmFindPackageFileList::~cmFindPackageFileList
                                  ((cmFindPackageFileList *)local_788);
                        if (lister_1._32_4_ == 0) {
                          this_local._7_1_ = 0;
                          lister_1.UseSuffixes = true;
                          lister_1._33_3_ = 0;
                        }
                      }
                    }
                  }
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_260);
            }
          }
        }
        std::__cxx11::string::~string((string *)&lister.UseSuffixes);
      }
    }
    else {
      this_local._7_1_ = 0;
    }
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("!prefix_in.empty() && prefix_in[prefix_in.size() - 1] == \'/\'",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFindPackageCommand.cxx"
                ,2000,"bool cmFindPackageCommand::SearchPrefix(const std::string &)");
}

Assistant:

bool cmFindPackageCommand::SearchPrefix(std::string const& prefix_in)
{
  assert(!prefix_in.empty() && prefix_in[prefix_in.size() - 1] == '/');
  if (this->DebugMode) {
    fprintf(stderr, "Checking prefix [%s]\n", prefix_in.c_str());
  }

  // Skip this if the prefix does not exist.
  if (!cmSystemTools::FileIsDirectory(prefix_in)) {
    return false;
  }

  //  PREFIX/ (useful on windows or in build trees)
  if (this->SearchDirectory(prefix_in)) {
    return true;
  }

  // Strip the trailing slash because the path generator is about to
  // add one.
  std::string prefix = prefix_in.substr(0, prefix_in.size() - 1);

  //  PREFIX/(cmake|CMake)/ (useful on windows or in build trees)
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  //  PREFIX/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  //  PREFIX/(Foo|foo|FOO).*/(cmake|CMake)/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  // Construct list of common install locations (lib and share).
  std::vector<std::string> common;
  if (!this->LibraryArchitecture.empty()) {
    common.push_back("lib/" + this->LibraryArchitecture);
  }
  if (this->UseLib32Paths) {
    common.push_back("lib32");
  }
  if (this->UseLib64Paths) {
    common.push_back("lib64");
  }
  if (this->UseLibx32Paths) {
    common.push_back("libx32");
  }
  common.push_back("lib");
  common.push_back("share");

  //  PREFIX/(lib/ARCH|lib|share)/cmake/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorFixed("cmake") /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  //  PREFIX/(lib/ARCH|lib|share)/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  //  PREFIX/(lib/ARCH|lib|share)/(Foo|foo|FOO).*/(cmake|CMake)/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib|share)/cmake/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorFixed("cmake") /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib|share)/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib|share)/(Foo|foo|FOO).*/(cmake|CMake)/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  return false;
}